

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzip2recover.c
# Opt level: O2

void mallocFail(Int32 n)

{
  fprintf(_stderr,"%s: malloc failed on request for %d bytes.\n",progName,0x18);
  fprintf(_stderr,"%s: warning: output file(s) may be incomplete.\n",progName);
  exit(1);
}

Assistant:

static void mallocFail ( Int32 n )
{
   fprintf ( stderr,
             "%s: malloc failed on request for %d bytes.\n",
            progName, n );
   fprintf ( stderr, "%s: warning: output file(s) may be incomplete.\n",
             progName );
   exit ( 1 );
}